

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

void __thiscall
cmQtAutoGenInitializer::ConfigFileNamesAndGenex
          (cmQtAutoGenInitializer *this,ConfigString *configString,string *genex,string_view prefix,
          string_view suffix)

{
  string_view sVar1;
  cmAlphaNum local_e0;
  cmQtAutoGenInitializer *local_b0;
  size_t local_a8;
  cmAlphaNum local_a0;
  string local_70;
  size_t local_50;
  char *local_48;
  cmQtAutoGenInitializer *local_40;
  char *local_38;
  string *local_30;
  string *genex_local;
  ConfigString *configString_local;
  cmQtAutoGenInitializer *this_local;
  string_view prefix_local;
  
  local_38 = prefix._M_str;
  local_40 = (cmQtAutoGenInitializer *)prefix._M_len;
  local_50 = suffix._M_len;
  local_48 = suffix._M_str;
  local_30 = genex;
  genex_local = &configString->Default;
  configString_local = (ConfigString *)this;
  this_local = local_40;
  prefix_local._M_len = (size_t)local_38;
  ConfigFileNames(this,configString,prefix,suffix);
  if ((this->MultiConfig & 1U) == 0) {
    std::__cxx11::string::operator=((string *)local_30,(string *)genex_local);
  }
  else {
    local_b0 = this_local;
    local_a8 = prefix_local._M_len;
    sVar1._M_str = (char *)prefix_local._M_len;
    sVar1._M_len = (size_t)this_local;
    cmAlphaNum::cmAlphaNum(&local_a0,sVar1);
    sVar1 = (string_view)::cm::operator____s("_$<CONFIG>",10);
    cmAlphaNum::cmAlphaNum(&local_e0,sVar1);
    cmStrCat<std::basic_string_view<char,std::char_traits<char>>>
              (&local_70,&local_a0,&local_e0,&suffix);
    std::__cxx11::string::operator=((string *)local_30,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

void cmQtAutoGenInitializer::ConfigFileNamesAndGenex(
  ConfigString& configString, std::string& genex, cm::string_view const prefix,
  cm::string_view const suffix)
{
  this->ConfigFileNames(configString, prefix, suffix);
  if (this->MultiConfig) {
    genex = cmStrCat(prefix, "_$<CONFIG>"_s, suffix);
  } else {
    genex = configString.Default;
  }
}